

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall CLIntercept::initBuiltinKernelOverrides(CLIntercept *this,cl_context context)

{
  mapped_type pSVar1;
  bool bVar2;
  mapped_type *ppSVar3;
  cl_icd_dispatch *pcVar4;
  cl_program p_Var5;
  cl_kernel p_Var6;
  cl_context in_RSI;
  CLIntercept *in_RDI;
  double dVar7;
  char *buildLog;
  size_t buildLogSize;
  cl_uint i;
  cl_device_id *devices;
  cl_uint numDevices;
  cl_int tempErrorCode;
  size_t programStringLength;
  char *pProgramString;
  SBuiltinKernelOverrides *pOverrides;
  cl_int errorCode;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_fffffffffffffdb8;
  lock_guard<std::mutex> *in_stack_fffffffffffffdc0;
  allocator *paVar8;
  allocator *in_stack_fffffffffffffdf8;
  map<_cl_context_*,_CLIntercept::SBuiltinKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SBuiltinKernelOverrides_*>_>_>
  *in_stack_fffffffffffffe00;
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [39];
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [32];
  map<_cl_context_*,_CLIntercept::SBuiltinKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SBuiltinKernelOverrides_*>_>_>
  *local_90;
  size_t local_88;
  uint local_7c;
  void *local_78;
  uint local_70;
  cl_int local_6c;
  size_t local_68;
  char *local_60;
  mapped_type local_58;
  cl_int local_50 [5];
  allocator local_39;
  string local_38 [40];
  cl_context local_10;
  
  local_10 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  std::allocator<char>::allocator();
  dVar7 = (double)std::__cxx11::string::string
                            (local_38,"Initializing builtin kernel overrides...\n",&local_39);
  log(in_RDI,dVar7);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_50[0] = 0;
  ppSVar3 = std::
            map<_cl_context_*,_CLIntercept::SBuiltinKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SBuiltinKernelOverrides_*>_>_>
            ::operator[](in_stack_fffffffffffffe00,(key_type *)in_stack_fffffffffffffdf8);
  local_58 = *ppSVar3;
  if (local_58 != (mapped_type)0x0) {
    pcVar4 = dispatch(in_RDI);
    local_50[0] = (*pcVar4->clReleaseKernel)(local_58->Kernel_block_motion_estimate_intel);
    pcVar4 = dispatch(in_RDI);
    local_50[0] = (*pcVar4->clReleaseProgram)(local_58->Program);
    if (local_58 != (mapped_type)0x0) {
      operator_delete(local_58);
    }
    local_58 = (mapped_type)0x0;
    ppSVar3 = std::
              map<_cl_context_*,_CLIntercept::SBuiltinKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SBuiltinKernelOverrides_*>_>_>
              ::operator[](in_stack_fffffffffffffe00,(key_type *)in_stack_fffffffffffffdf8);
    *ppSVar3 = (mapped_type)0x0;
  }
  local_58 = (mapped_type)operator_new(0x10);
  if (local_58 != (mapped_type)0x0) {
    local_58->Program = (cl_program)0x0;
    local_58->Kernel_block_motion_estimate_intel = (cl_kernel)0x0;
    local_60 = (char *)0x0;
    local_68 = 0;
    if ((local_50[0] == 0) &&
       (bVar2 = ::OS::Services::GetBuiltinKernelString(&in_RDI->m_OS,&local_60,&local_68), !bVar2))
    {
      local_50[0] = -0x1e;
    }
    if (local_50[0] == 0) {
      pcVar4 = dispatch(in_RDI);
      p_Var5 = (*pcVar4->clCreateProgramWithSource)(local_10,1,&local_60,&local_68,local_50);
      local_58->Program = p_Var5;
    }
    if (local_50[0] == 0) {
      pcVar4 = dispatch(in_RDI);
      local_50[0] = (*pcVar4->clBuildProgram)
                              (local_58->Program,0,(cl_device_id *)0x0,
                               "-Dcl_intel_device_side_vme_enable -DHW_NULL_CHECK",
                               (_func_void_cl_program_void_ptr *)0x0,(void *)0x0);
      if (local_50[0] != 0) {
        local_6c = 0;
        local_70 = 0;
        pcVar4 = dispatch(in_RDI);
        local_6c = (*pcVar4->clGetContextInfo)(local_10,0x1083,4,&local_70,(size_t *)0x0);
        if ((local_70 != 0) &&
           (local_78 = operator_new__((ulong)local_70 << 3), local_78 != (void *)0x0)) {
          pcVar4 = dispatch(in_RDI);
          local_6c = (*pcVar4->clGetContextInfo)
                               (local_10,0x1081,(ulong)local_70 << 3,local_78,(size_t *)0x0);
          if (local_6c == 0) {
            for (local_7c = 0; local_7c < local_70; local_7c = local_7c + 1) {
              local_88 = 0;
              pcVar4 = dispatch(in_RDI);
              (*pcVar4->clGetProgramBuildInfo)
                        (local_58->Program,*(cl_device_id *)((long)local_78 + (ulong)local_7c * 8),
                         0x1183,0,(void *)0x0,&local_88);
              local_90 = (map<_cl_context_*,_CLIntercept::SBuiltinKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SBuiltinKernelOverrides_*>_>_>
                          *)operator_new__(local_88 + 1);
              if (local_90 !=
                  (map<_cl_context_*,_CLIntercept::SBuiltinKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SBuiltinKernelOverrides_*>_>_>
                   *)0x0) {
                pcVar4 = dispatch(in_RDI);
                (*pcVar4->clGetProgramBuildInfo)
                          (local_58->Program,*(cl_device_id *)((long)local_78 + (ulong)local_7c * 8)
                           ,0x1183,local_88,local_90,(size_t *)0x0);
                (&(local_90->_M_t)._M_impl.field_0x0)[local_88] = 0;
                std::allocator<char>::allocator();
                dVar7 = (double)std::__cxx11::string::string
                                          (local_b0,"-------> Start of Build Log:\n",&local_b1);
                log(in_RDI,dVar7);
                std::__cxx11::string::~string(local_b0);
                std::allocator<char>::~allocator((allocator<char> *)&local_b1);
                in_stack_fffffffffffffe00 = local_90;
                std::allocator<char>::allocator();
                dVar7 = (double)std::__cxx11::string::string
                                          (local_d8,(char *)in_stack_fffffffffffffe00,&local_d9);
                log(in_RDI,dVar7);
                std::__cxx11::string::~string(local_d8);
                std::allocator<char>::~allocator((allocator<char> *)&local_d9);
                in_stack_fffffffffffffdf8 = &local_101;
                std::allocator<char>::allocator();
                dVar7 = (double)std::__cxx11::string::string
                                          (local_100,"<------- End of Build Log!\n",
                                           in_stack_fffffffffffffdf8);
                log(in_RDI,dVar7);
                std::__cxx11::string::~string(local_100);
                std::allocator<char>::~allocator((allocator<char> *)&local_101);
                if (local_90 !=
                    (map<_cl_context_*,_CLIntercept::SBuiltinKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SBuiltinKernelOverrides_*>_>_>
                     *)0x0) {
                  operator_delete__(local_90);
                }
              }
            }
          }
        }
      }
    }
    if (local_50[0] == 0) {
      pcVar4 = dispatch(in_RDI);
      p_Var6 = (*pcVar4->clCreateKernel)(local_58->Program,"block_motion_estimate_intel",local_50);
      local_58->Kernel_block_motion_estimate_intel = p_Var6;
    }
    pSVar1 = local_58;
    if (local_50[0] == 0) {
      ppSVar3 = std::
                map<_cl_context_*,_CLIntercept::SBuiltinKernelOverrides_*,_std::less<_cl_context_*>,_std::allocator<std::pair<_cl_context_*const,_CLIntercept::SBuiltinKernelOverrides_*>_>_>
                ::operator[](in_stack_fffffffffffffe00,(key_type *)in_stack_fffffffffffffdf8);
      *ppSVar3 = pSVar1;
    }
    else {
      if (local_58 != (mapped_type)0x0) {
        operator_delete(local_58);
      }
      local_58 = (mapped_type)0x0;
    }
  }
  paVar8 = &local_129;
  std::allocator<char>::allocator();
  dVar7 = (double)std::__cxx11::string::string
                            (local_128,"... builtin kernel override initialization complete.\n",
                             paVar8);
  log(in_RDI,dVar7);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x215c5f);
  return;
}

Assistant:

void CLIntercept::initBuiltinKernelOverrides(
    const cl_context context )
{
    std::lock_guard<std::mutex> lock(m_Mutex);
    log( "Initializing builtin kernel overrides...\n" );

    cl_int  errorCode = CL_SUCCESS;

    // Check to see if overrides already exist.  If they do, release them.
    SBuiltinKernelOverrides*    pOverrides =
        m_BuiltinKernelOverridesMap[ context ];
    if( pOverrides )
    {
        errorCode = dispatch().clReleaseKernel( pOverrides->Kernel_block_motion_estimate_intel );

        errorCode = dispatch().clReleaseProgram( pOverrides->Program );

        delete pOverrides;
        pOverrides = NULL;

        m_BuiltinKernelOverridesMap[ context ] = NULL;
    }

    // Allocate new overrides.
    pOverrides = new SBuiltinKernelOverrides;
    if( pOverrides )
    {
        pOverrides->Program = NULL;

        pOverrides->Kernel_block_motion_estimate_intel = NULL;

        const char* pProgramString = NULL;
        size_t  programStringLength = 0;

        // Get the builtin kernel program string.
        if( errorCode == CL_SUCCESS )
        {
            if( m_OS.GetBuiltinKernelString(
                    pProgramString,
                    programStringLength ) == false )
            {
                errorCode = CL_INVALID_VALUE;
            }
        }

        // Create the program:
        if( errorCode == CL_SUCCESS )
        {
            pOverrides->Program = dispatch().clCreateProgramWithSource(
                context,
                1,
                &pProgramString,
                &programStringLength,
                &errorCode );
        }

        // Build the program:
        if( errorCode == CL_SUCCESS )
        {
            errorCode = dispatch().clBuildProgram(
                pOverrides->Program,
                0,
                NULL,
                "-Dcl_intel_device_side_vme_enable -DHW_NULL_CHECK",
                NULL,
                NULL );

            if( errorCode != CL_SUCCESS )
            {
                cl_int  tempErrorCode = CL_SUCCESS;

                // Get the number of devices for this context.
                cl_uint numDevices = 0;
                tempErrorCode = dispatch().clGetContextInfo(
                    context,
                    CL_CONTEXT_NUM_DEVICES,
                    sizeof( numDevices ),
                    &numDevices,
                    NULL );

                if( numDevices != 0 )
                {
                    cl_device_id*   devices = new cl_device_id[ numDevices ];
                    if( devices )
                    {
                        tempErrorCode = dispatch().clGetContextInfo(
                            context,
                            CL_CONTEXT_DEVICES,
                            numDevices * sizeof( cl_device_id ),
                            devices,
                            NULL );

                        if( tempErrorCode == CL_SUCCESS )
                        {
                            for( cl_uint i = 0; i < numDevices; i++ )
                            {
                                size_t  buildLogSize = 0;
                                dispatch().clGetProgramBuildInfo(
                                    pOverrides->Program,
                                    devices[ i ],
                                    CL_PROGRAM_BUILD_LOG,
                                    0,
                                    NULL,
                                    &buildLogSize );

                                char*   buildLog = new char[ buildLogSize + 1 ];
                                if( buildLog )
                                {
                                    dispatch().clGetProgramBuildInfo(
                                        pOverrides->Program,
                                        devices[ i ],
                                        CL_PROGRAM_BUILD_LOG,
                                        buildLogSize * sizeof( char ),
                                        buildLog,
                                        NULL );

                                    buildLog[ buildLogSize ] = '\0';

                                    log( "-------> Start of Build Log:\n" );
                                    log( buildLog );
                                    log( "<------- End of Build Log!\n" );

                                    delete [] buildLog;
                                }
                            }
                        }
                    }
                }
            }
        }

        // Create all of the kernels in the program:

        if( errorCode == CL_SUCCESS )
        {
            pOverrides->Kernel_block_motion_estimate_intel = dispatch().clCreateKernel(
                pOverrides->Program,
                "block_motion_estimate_intel",
                &errorCode );
        }

        if( errorCode == CL_SUCCESS )
        {
            m_BuiltinKernelOverridesMap[ context ] = pOverrides;
        }
        else
        {
            delete pOverrides;
            pOverrides = NULL;
        }
    }

    log( "... builtin kernel override initialization complete.\n" );
}